

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O2

void * parseNumber(SymbolContext<char> *ctx)

{
  undefined4 *puVar1;
  size_t in_RCX;
  void *__buf;
  double dVar2;
  SymbolContext<char> local_30;
  
  puVar1 = (undefined4 *)operator_new(0x10);
  Centaurus::SymbolContext<char>::read_abi_cxx11_(&local_30,(int)ctx,__buf,in_RCX);
  dVar2 = std::__cxx11::stod((string *)&local_30,(size_t *)0x0);
  *puVar1 = 1;
  *(double *)(puVar1 + 2) = dVar2;
  std::__cxx11::string::~string((string *)&local_30);
  return puVar1;
}

Assistant:

void *parseNumber(const SymbolContext<char>& ctx)
{
    return new JSONValue(std::stod(ctx.read()));
}